

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprPointerLiteral * AllocateTypeStorage(ExpressionEvalContext *ctx,SynBase *source,TypeBase *type)

{
  ExprPointerLiteral *pEVar1;
  ExprPointerLiteral *pEVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ExprPointerLiteral **ppEVar6;
  TypeRef *pTVar7;
  undefined4 extraout_var;
  uchar *memory;
  ExprPointerLiteral *ptr;
  uint i;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionEvalContext *ctx_local;
  uchar *ptr_00;
  
  bVar3 = isType<TypeError>(type);
  if (bVar3) {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  else {
    for (ptr._4_4_ = 0; uVar4 = SmallArray<ExprPointerLiteral_*,_32U>::size(&ctx->abandonedMemory),
        ptr._4_4_ < uVar4; ptr._4_4_ = ptr._4_4_ + 1) {
      ppEVar6 = SmallArray<ExprPointerLiteral_*,_32U>::operator[](&ctx->abandonedMemory,ptr._4_4_);
      pEVar1 = *ppEVar6;
      if ((long)pEVar1->end - (long)pEVar1->ptr == type->size) {
        pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,type);
        (pEVar1->super_ExprBase).type = &pTVar7->super_TypeBase;
        memset(pEVar1->ptr,0,type->size & 0xffffffff);
        ppEVar6 = SmallArray<ExprPointerLiteral_*,_32U>::back(&ctx->abandonedMemory);
        pEVar2 = *ppEVar6;
        ppEVar6 = SmallArray<ExprPointerLiteral_*,_32U>::operator[](&ctx->abandonedMemory,ptr._4_4_)
        ;
        *ppEVar6 = pEVar2;
        SmallArray<ExprPointerLiteral_*,_32U>::pop_back(&ctx->abandonedMemory);
        return pEVar1;
      }
    }
    if ((long)(ulong)ctx->variableMemoryLimit < type->size) {
      ctx_local = (ExpressionEvalContext *)Report(ctx,"ERROR: single variable memory limit");
    }
    else if ((long)(ulong)ctx->totalMemoryLimit < (long)((ulong)ctx->totalMemory + type->size)) {
      ctx_local = (ExpressionEvalContext *)Report(ctx,"ERROR: total variable memory limit");
    }
    else {
      ctx->totalMemory = (int)type->size + ctx->totalMemory;
      iVar5 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
      ptr_00 = (uchar *)CONCAT44(extraout_var,iVar5);
      memset(ptr_00,0,type->size & 0xffffffff);
      ctx_local = (ExpressionEvalContext *)ExpressionContext::get<ExprPointerLiteral>(ctx->ctx);
      pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,type);
      ExprPointerLiteral::ExprPointerLiteral
                ((ExprPointerLiteral *)ctx_local,source,&pTVar7->super_TypeBase,ptr_00,
                 ptr_00 + type->size);
    }
  }
  return (ExprPointerLiteral *)ctx_local;
}

Assistant:

ExprPointerLiteral* AllocateTypeStorage(ExpressionEvalContext &ctx, SynBase *source, TypeBase *type)
{
	if(isType<TypeError>(type))
		return NULL;

	for(unsigned i = 0; i < ctx.abandonedMemory.size(); i++)
	{
		ExprPointerLiteral *ptr = ctx.abandonedMemory[i];

		if(ptr->end - ptr->ptr == type->size)
		{
			ptr->type = ctx.ctx.GetReferenceType(type);

			memset(ptr->ptr, 0, unsigned(type->size));

			ctx.abandonedMemory[i] = ctx.abandonedMemory.back();
			ctx.abandonedMemory.pop_back();

			return ptr;
		}
	}

	if(type->size > ctx.variableMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: single variable memory limit");

	if(ctx.totalMemory + type->size > ctx.totalMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: total variable memory limit");

	ctx.totalMemory += unsigned(type->size);

	unsigned char *memory = (unsigned char*)ctx.ctx.allocator->alloc(unsigned(type->size));

	memset(memory, 0, unsigned(type->size));

	return new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(source, ctx.ctx.GetReferenceType(type), memory, memory + type->size);
}